

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool op_strd_ri(DisasContext_conflict1 *s,arg_ldst_ri *a,int rt2)

{
  TCGContext_conflict1 *s_00;
  undefined1 extraout_AL;
  TCGv_i32 a32;
  TCGv_i32 pTVar1;
  ARMMMUIdx index;
  uintptr_t o;
  
  s_00 = s->uc->tcg_ctx;
  index = s->mmu_idx & 0xf;
  a32 = op_addr_ri_pre(s,a);
  pTVar1 = load_reg(s,a->rt);
  gen_aa32_st_i32(s,pTVar1,a32,index,s->be_data | MO_32);
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar1 + (long)s_00));
  tcg_gen_addi_i32_aarch64(s_00,a32,a32,4);
  pTVar1 = load_reg(s,rt2);
  gen_aa32_st_i32(s,pTVar1,a32,index,s->be_data | MO_32);
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar1 + (long)s_00));
  op_addr_ri_post(s,a,a32,-4);
  return (_Bool)extraout_AL;
}

Assistant:

static bool op_strd_ri(DisasContext *s, arg_ldst_ri *a, int rt2)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int mem_idx = get_mem_index(s);
    TCGv_i32 addr, tmp;

    addr = op_addr_ri_pre(s, a);

    tmp = load_reg(s, a->rt);
    gen_aa32_st_i32(s, tmp, addr, mem_idx, MO_UL | s->be_data);
    tcg_temp_free_i32(tcg_ctx, tmp);

    tcg_gen_addi_i32(tcg_ctx, addr, addr, 4);

    tmp = load_reg(s, rt2);
    gen_aa32_st_i32(s, tmp, addr, mem_idx, MO_UL | s->be_data);
    tcg_temp_free_i32(tcg_ctx, tmp);

    op_addr_ri_post(s, a, addr, -4);
    return true;
}